

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_test.cpp
# Opt level: O1

void __thiscall HuffmanTest::test_read_char(HuffmanTest *this,char ch)

{
  char cVar1;
  BitReader out;
  stringstream os;
  char local_1a9;
  BitReader local_1a8;
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  BitReader::BitReader(&local_1a8,(istream *)local_198);
  local_1a9 = ch;
  std::__ostream_insert<char,std::char_traits<char>>(local_188,&local_1a9,1);
  cVar1 = BitReader::read_char(&local_1a8);
  Test::check(cVar1 == ch,"test_read_char",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/test/huffman_test.cpp"
              ,0x3d);
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void HuffmanTest::test_read_char(char ch) {
    std::stringstream os;
    BitReader out(os);
    os << ch;
    char res = out.read_char();
    DO_CHECK(res == ch);
}